

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

Symbol * addLabel(char *symName)

{
  bool bVar1;
  uint32_t uVar2;
  Section *pSVar3;
  Symbol *local_20;
  Symbol *sym;
  char *symName_local;
  
  if (*symName == '.') {
    __assert_fail("symName[0] != \'.\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x1c2,"addLabel");
  }
  local_20 = sym_FindExactSymbol(symName);
  if (local_20 == (Symbol *)0x0) {
    local_20 = createsymbol(symName);
  }
  else {
    bVar1 = sym_IsDefined(local_20);
    if (bVar1) {
      error("\'%s\' already defined at ",symName);
      dumpFilename(local_20);
      putc(10,_stderr);
      return (Symbol *)0x0;
    }
    updateSymbolFilename(local_20);
  }
  local_20->type = SYM_LABEL;
  uVar2 = sect_GetSymbolOffset();
  (local_20->field_8).value = uVar2;
  if (((exportAll & 1U) != 0) && (*symName != '!')) {
    local_20->isExported = true;
  }
  pSVar3 = sect_GetSymbolSection();
  local_20->section = pSVar3;
  if ((local_20 != (Symbol *)0x0) && (local_20->section == (Section *)0x0)) {
    error("Label \"%s\" created outside of a SECTION\n",symName);
  }
  return local_20;
}

Assistant:

static struct Symbol *addLabel(char const *symName)
{
	assert(symName[0] != '.'); // The symbol name must have been expanded prior
	struct Symbol *sym = sym_FindExactSymbol(symName);

	if (!sym) {
		sym = createsymbol(symName);
	} else if (sym_IsDefined(sym)) {
		error("'%s' already defined at ", symName);
		dumpFilename(sym);
		putc('\n', stderr);
		return NULL;
	} else {
		updateSymbolFilename(sym);
	}
	// If the symbol already exists as a ref, just "take over" it
	sym->type = SYM_LABEL;
	sym->value = sect_GetSymbolOffset();
	// Don't export anonymous labels
	if (exportAll && symName[0] != '!')
		sym->isExported = true;
	sym->section = sect_GetSymbolSection();

	if (sym && !sym->section)
		error("Label \"%s\" created outside of a SECTION\n", symName);
	return sym;
}